

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void arm_cpu_class_init_arm(uc_struct_conflict1 *uc,CPUClass *oc)

{
  oc[1].has_work = (_func__Bool_CPUState_ptr_conflict *)oc->reset;
  oc->reset = arm_cpu_reset;
  oc->has_work = arm_cpu_has_work;
  oc->cpu_exec_interrupt = arm_cpu_exec_interrupt_arm;
  oc->set_pc = arm_cpu_set_pc;
  oc->synchronize_from_tb = arm_cpu_synchronize_from_tb;
  oc->do_interrupt = arm_cpu_do_interrupt_arm;
  oc->get_phys_page_attrs_debug = arm_cpu_get_phys_page_attrs_debug_arm;
  oc->asidx_from_attrs = arm_asidx_from_attrs;
  oc->tcg_initialize = arm_translate_init_arm;
  oc->tlb_fill_cpu = arm_cpu_tlb_fill_arm;
  oc->debug_excp_handler = arm_debug_excp_handler_arm;
  oc->do_unaligned_access = arm_cpu_do_unaligned_access_arm;
  return;
}

Assistant:

void arm_cpu_class_init(struct uc_struct *uc, CPUClass *oc)
{
    ARMCPUClass *acc = ARM_CPU_CLASS(oc);
    CPUClass *cc = CPU_CLASS(acc);

    /* parent class is CPUClass, parent_reset() is cpu_common_reset(). */
    acc->parent_reset = cc->reset;
    /* overwrite the CPUClass->reset to arch reset: arm_cpu_reset(). */
    cc->reset = arm_cpu_reset;

    cc->has_work = arm_cpu_has_work;
    cc->cpu_exec_interrupt = arm_cpu_exec_interrupt;
    cc->set_pc = arm_cpu_set_pc;
    cc->synchronize_from_tb = arm_cpu_synchronize_from_tb;
    cc->do_interrupt = arm_cpu_do_interrupt;
    cc->get_phys_page_attrs_debug = arm_cpu_get_phys_page_attrs_debug;
    cc->asidx_from_attrs = arm_asidx_from_attrs;
    cc->tcg_initialize = arm_translate_init;
    cc->tlb_fill_cpu = arm_cpu_tlb_fill;
    cc->debug_excp_handler = arm_debug_excp_handler;
    cc->do_unaligned_access = arm_cpu_do_unaligned_access;
}